

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_lazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *piVar1;
  BYTE *iEnd;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  BYTE *pBVar11;
  seqDef *psVar12;
  U32 UVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  long lVar16;
  ulong uVar17;
  int *piVar18;
  uint uVar19;
  U32 UVar20;
  ulong uVar21;
  U32 UVar22;
  int iVar23;
  BYTE *litEnd;
  uint local_b4;
  size_t ofbCandidate;
  uint local_a4;
  ulong local_a0;
  int local_98;
  U32 maxDistance;
  int *local_90;
  BYTE *local_88;
  BYTE *local_80;
  BYTE *local_78;
  BYTE *litLimit_w;
  ulong local_68;
  BYTE *local_60;
  int *local_58;
  seqStore_t *local_50;
  int *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_88 = (ms->window).base;
  local_78 = (ms->window).dictBase;
  uVar6 = (ms->window).dictLimit;
  local_a0 = (ulong)uVar6;
  local_80 = local_88 + local_a0;
  local_60 = local_78 + local_a0;
  local_40 = local_78 + (ms->window).lowLimit;
  uVar4 = (ms->cParams).windowLog;
  uVar5 = (ms->cParams).minMatch;
  uVar19 = 6;
  if (uVar5 < 6) {
    uVar19 = uVar5;
  }
  uVar5 = 4;
  if (4 < uVar19) {
    uVar5 = uVar19;
  }
  UVar22 = *rep;
  local_b4 = rep[1];
  ms->lazySkipping = 0;
  maxDistance = 1 << ((byte)uVar4 & 0x1f);
  piVar18 = (int *)((ulong)(local_80 == (BYTE *)src) + (long)src);
  iEnd = (BYTE *)((long)src + srcSize);
  local_58 = (int *)((long)src + (srcSize - 8));
  litLimit_w = (BYTE *)((long)src + (srcSize - 0x20));
  local_98 = uVar6 - 1;
  piVar1 = (int *)src;
  local_38 = rep;
LAB_00f4b0f9:
  do {
    local_48 = piVar1;
    local_a4 = UVar22;
    if (local_58 <= piVar18) {
      *local_38 = local_a4;
      local_38[1] = local_b4;
      return (long)iEnd - (long)local_48;
    }
    iVar23 = (int)piVar18 - (int)local_88;
    iVar7 = iVar23 + 1;
    UVar22 = (ms->window).lowLimit;
    UVar13 = iVar7 - maxDistance;
    if (iVar7 - UVar22 <= maxDistance) {
      UVar13 = UVar22;
    }
    if (ms->loadedDictEnd != 0) {
      UVar13 = UVar22;
    }
    uVar6 = iVar7 - local_a4;
    pBVar11 = local_78;
    if ((uint)local_a0 <= uVar6) {
      pBVar11 = local_88;
    }
    local_90 = (int *)((long)piVar18 + 1);
    if (local_98 - uVar6 < 3) {
LAB_00f4b1a3:
      uVar17 = 0;
    }
    else {
      uVar17 = 0;
      if (local_a4 <= (iVar23 - UVar13) + 1) {
        if (*local_90 != *(int *)(pBVar11 + uVar6)) goto LAB_00f4b1a3;
        pBVar14 = local_60;
        if ((uint)local_a0 <= uVar6) {
          pBVar14 = iEnd;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar18 + 5),(BYTE *)((long)(pBVar11 + uVar6) + 4),iEnd,
                           pBVar14,local_80);
        uVar17 = sVar8 + 4;
      }
    }
    ofbCandidate = 999999999;
    if (uVar5 == 6) {
      uVar9 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar18,iEnd,&ofbCandidate);
    }
    else if (uVar5 == 5) {
      uVar9 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar18,iEnd,&ofbCandidate);
    }
    else {
      uVar9 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar18,iEnd,&ofbCandidate);
    }
    uVar10 = uVar17;
    if (uVar17 < uVar9) {
      uVar10 = uVar9;
    }
    if (uVar10 < 4) {
      uVar17 = (long)piVar18 - (long)local_48;
      piVar18 = (int *)((long)piVar18 + (uVar17 >> 8) + 1);
      ms->lazySkipping = (uint)(0x8ff < uVar17);
      UVar22 = local_a4;
      piVar1 = local_48;
      goto LAB_00f4b0f9;
    }
    uVar21 = 1;
    piVar1 = local_90;
    local_50 = seqStore;
    if (uVar17 < uVar9) {
      uVar21 = ofbCandidate;
      piVar1 = piVar18;
    }
LAB_00f4b25c:
    do {
      local_90 = piVar1;
      uVar9 = uVar10;
      uVar17 = uVar21;
      if (local_58 <= piVar18) break;
      piVar1 = (int *)((long)piVar18 + 1);
      iVar7 = iVar23 + 1;
      local_68 = CONCAT44(local_68._4_4_,iVar7);
      if (uVar21 == 0) {
        uVar21 = 0;
      }
      else {
        UVar22 = (ms->window).lowLimit;
        UVar13 = iVar7 - maxDistance;
        if (iVar7 - UVar22 <= maxDistance) {
          UVar13 = UVar22;
        }
        if (ms->loadedDictEnd != 0) {
          UVar13 = UVar22;
        }
        uVar6 = iVar7 - local_a4;
        pBVar11 = local_88;
        if (uVar6 < (uint)local_a0) {
          pBVar11 = local_78;
        }
        if (((2 < local_98 - uVar6) && (local_a4 <= iVar7 - UVar13)) &&
           (*piVar1 == *(int *)(pBVar11 + uVar6))) {
          pBVar14 = iEnd;
          if (uVar6 < (uint)local_a0) {
            pBVar14 = local_60;
          }
          sVar8 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar18 + 5),(BYTE *)((long)(pBVar11 + uVar6) + 4),iEnd,
                             pBVar14,local_80);
          if (sVar8 < 0xfffffffffffffffc) {
            uVar6 = 0x1f;
            if ((uint)uVar21 != 0) {
              for (; (uint)uVar21 >> uVar6 == 0; uVar6 = uVar6 - 1) {
              }
            }
            if ((int)((uVar6 ^ 0x1f) + (int)uVar9 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
              uVar21 = 1;
              uVar9 = sVar8 + 4;
              local_90 = piVar1;
            }
          }
        }
      }
      ofbCandidate = 999999999;
      if (uVar5 == 6) {
        uVar10 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar1,iEnd,&ofbCandidate);
      }
      else if (uVar5 == 5) {
        uVar10 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar1,iEnd,&ofbCandidate);
      }
      else {
        uVar10 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar1,iEnd,&ofbCandidate);
      }
      seqStore = local_50;
      if (3 < uVar10) {
        uVar6 = 0x1f;
        if ((uint)uVar21 != 0) {
          for (; (uint)uVar21 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        iVar7 = 0x1f;
        if ((uint)ofbCandidate != 0) {
          for (; (uint)ofbCandidate >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        if ((int)((uVar6 ^ 0x1f) + (int)uVar9 * 4 + -0x1b) < (int)uVar10 * 4 - iVar7) {
          piVar18 = piVar1;
          uVar21 = ofbCandidate;
          iVar23 = (int)local_68;
          goto LAB_00f4b25c;
        }
      }
      uVar17 = uVar21;
      if (local_58 <= piVar1) break;
      piVar1 = (int *)((long)piVar18 + 2);
      iVar23 = iVar23 + 2;
      if (uVar21 == 0) {
        uVar17 = 0;
      }
      else {
        UVar22 = (ms->window).lowLimit;
        UVar13 = iVar23 - maxDistance;
        if (iVar23 - UVar22 <= maxDistance) {
          UVar13 = UVar22;
        }
        if (ms->loadedDictEnd != 0) {
          UVar13 = UVar22;
        }
        uVar6 = iVar23 - local_a4;
        pBVar11 = local_88;
        if (uVar6 < (uint)local_a0) {
          pBVar11 = local_78;
        }
        if (((2 < local_98 - uVar6) && (local_a4 <= iVar23 - UVar13)) &&
           (*piVar1 == *(int *)(pBVar11 + uVar6))) {
          pBVar14 = iEnd;
          if (uVar6 < (uint)local_a0) {
            pBVar14 = local_60;
          }
          local_68 = uVar21;
          sVar8 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar18 + 6),(BYTE *)((long)(pBVar11 + uVar6) + 4),iEnd,
                             pBVar14,local_80);
          uVar17 = local_68;
          if (sVar8 < 0xfffffffffffffffc) {
            uVar6 = 0x1f;
            if ((uint)local_68 != 0) {
              for (; (uint)local_68 >> uVar6 == 0; uVar6 = uVar6 - 1) {
              }
            }
            if ((int)((uVar6 ^ 0x1f) + (int)uVar9 * 4 + -0x1e) < (int)(sVar8 + 4) * 4) {
              uVar17 = 1;
              uVar9 = sVar8 + 4;
              local_90 = piVar1;
            }
          }
        }
      }
      ofbCandidate = 999999999;
      if (uVar5 == 6) {
        uVar10 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar1,iEnd,&ofbCandidate);
      }
      else if (uVar5 == 5) {
        uVar10 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar1,iEnd,&ofbCandidate);
      }
      else {
        uVar10 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar1,iEnd,&ofbCandidate);
      }
      if (uVar10 < 4) break;
      uVar6 = 0x1f;
      if ((uint)uVar17 != 0) {
        for (; (uint)uVar17 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      iVar7 = 0x1f;
      if ((uint)ofbCandidate != 0) {
        for (; (uint)ofbCandidate >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      piVar18 = piVar1;
      uVar21 = ofbCandidate;
    } while ((int)((uVar6 ^ 0x1f) + (int)uVar9 * 4 + -0x18) < (int)uVar10 * 4 - iVar7);
    piVar18 = local_90;
    if (3 < uVar17) {
      pBVar15 = (BYTE *)((long)local_90 + (-(long)local_88 - uVar17) + 3);
      pBVar14 = local_80;
      pBVar11 = local_88;
      if ((uint)pBVar15 < (uint)local_a0) {
        pBVar14 = local_40;
        pBVar11 = local_78;
      }
      pBVar11 = pBVar11 + ((ulong)pBVar15 & 0xffffffff);
      for (; ((local_48 < piVar18 && (pBVar14 < pBVar11)) &&
             (*(BYTE *)((long)piVar18 + -1) == pBVar11[-1])); piVar18 = (int *)((long)piVar18 + -1))
      {
        pBVar11 = pBVar11 + -1;
        uVar9 = uVar9 + 1;
      }
      local_b4 = local_a4;
      local_a4 = (U32)uVar17 - 3;
    }
    uVar10 = (long)piVar18 - (long)local_48;
    pBVar11 = seqStore->lit;
    if (litLimit_w < piVar18) {
      ZSTD_safecopyLiterals(pBVar11,(BYTE *)local_48,(BYTE *)piVar18,litLimit_w);
LAB_00f4b5f7:
      seqStore->lit = seqStore->lit + uVar10;
      psVar12 = seqStore->sequences;
      if (0xffff < uVar10) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar3 = *(undefined8 *)(local_48 + 2);
      *(undefined8 *)pBVar11 = *(undefined8 *)local_48;
      *(undefined8 *)(pBVar11 + 8) = uVar3;
      pBVar11 = seqStore->lit;
      if (0x10 < uVar10) {
        uVar3 = *(undefined8 *)(local_48 + 6);
        *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)(local_48 + 4);
        *(undefined8 *)(pBVar11 + 0x18) = uVar3;
        if (0x20 < (long)uVar10) {
          lVar16 = 0;
          do {
            puVar2 = (undefined8 *)((long)local_48 + lVar16 + 0x20);
            uVar3 = puVar2[1];
            pBVar14 = pBVar11 + lVar16 + 0x20;
            *(undefined8 *)pBVar14 = *puVar2;
            *(undefined8 *)(pBVar14 + 8) = uVar3;
            puVar2 = (undefined8 *)((long)local_48 + lVar16 + 0x30);
            uVar3 = puVar2[1];
            *(undefined8 *)(pBVar14 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar14 + 0x18) = uVar3;
            lVar16 = lVar16 + 0x20;
          } while (pBVar14 + 0x20 < pBVar11 + uVar10);
        }
        goto LAB_00f4b5f7;
      }
      seqStore->lit = pBVar11 + uVar10;
      psVar12 = seqStore->sequences;
    }
    psVar12->litLength = (U16)uVar10;
    psVar12->offBase = (U32)uVar17;
    if (0xffff < uVar9 - 3) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar12->mlBase = (U16)(uVar9 - 3);
    seqStore->sequences = psVar12 + 1;
    if (ms->lazySkipping != 0) {
      ms->lazySkipping = 0;
    }
    uVar6 = local_a4;
    for (piVar18 = (int *)((long)piVar18 + uVar9); UVar22 = uVar6, piVar1 = piVar18,
        piVar18 <= local_58; piVar18 = (int *)((long)piVar18 + sVar8 + 4)) {
      iVar7 = (int)piVar18 - (int)local_88;
      UVar13 = (ms->window).lowLimit;
      UVar20 = iVar7 - maxDistance;
      if (iVar7 - UVar13 <= maxDistance) {
        UVar20 = UVar13;
      }
      if (ms->loadedDictEnd != 0) {
        UVar20 = UVar13;
      }
      uVar6 = iVar7 - local_b4;
      pBVar11 = local_88;
      if (uVar6 < (uint)local_a0) {
        pBVar11 = local_78;
      }
      if (((local_98 - uVar6 < 3) || (iVar7 - UVar20 < local_b4)) ||
         (*piVar18 != *(int *)(pBVar11 + uVar6))) break;
      pBVar14 = iEnd;
      if (uVar6 < (uint)local_a0) {
        pBVar14 = local_60;
      }
      sVar8 = ZSTD_count_2segments
                        ((BYTE *)(piVar18 + 1),(BYTE *)((long)(pBVar11 + uVar6) + 4),iEnd,pBVar14,
                         local_80);
      pBVar11 = seqStore->lit;
      if (litLimit_w < piVar18) {
        ZSTD_safecopyLiterals(pBVar11,(BYTE *)piVar18,(BYTE *)piVar18,litLimit_w);
      }
      else {
        uVar3 = *(undefined8 *)(piVar18 + 2);
        *(undefined8 *)pBVar11 = *(undefined8 *)piVar18;
        *(undefined8 *)(pBVar11 + 8) = uVar3;
      }
      psVar12 = seqStore->sequences;
      psVar12->litLength = 0;
      psVar12->offBase = 1;
      if (0xffff < sVar8 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar12->mlBase = (U16)(sVar8 + 1);
      seqStore->sequences = psVar12 + 1;
      uVar6 = local_b4;
      local_b4 = UVar22;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2);
}